

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCutUtils.c
# Opt level: O1

void Map_CutListRecycle(Map_Man_t *p,Map_Cut_t *pSetList,Map_Cut_t *pSave)

{
  Map_Cut_t *pMVar1;
  
  if (pSetList != (Map_Cut_t *)0x0) {
    pMVar1 = pSetList->pNext;
    while( true ) {
      if (pSetList != pSave) {
        Extra_MmFixedEntryRecycle(p->mmCuts,(char *)pSetList);
      }
      if (pMVar1 == (Map_Cut_t *)0x0) break;
      pSetList = pMVar1;
      pMVar1 = pMVar1->pNext;
    }
  }
  return;
}

Assistant:

void Map_CutListRecycle( Map_Man_t * p, Map_Cut_t * pSetList, Map_Cut_t * pSave )
{
    Map_Cut_t * pNext, * pTemp;
    for ( pTemp = pSetList, pNext = pTemp? pTemp->pNext : NULL; 
          pTemp; 
          pTemp = pNext, pNext = pNext? pNext->pNext : NULL )
        if ( pTemp != pSave )
            Extra_MmFixedEntryRecycle( p->mmCuts, (char *)pTemp );
}